

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchNewQbf.cpp
# Opt level: O0

void Bmatch_PrepareFinalOut(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtkQbf,int ILP_Constraint)

{
  Abc_Aig_t *pAVar1;
  char *p0;
  int iVar2;
  ostream *poVar3;
  Abc_Obj_t *pAVar4;
  reference ppAVar5;
  size_type sVar6;
  Abc_Obj_t *pAVar7;
  int local_68;
  int n;
  int i_1;
  int local_54;
  int i;
  char *pName;
  Abc_Obj_t *pObjTmp;
  Abc_Obj_t *pObj;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> XorOuts;
  int ILP_Constraint_local;
  Abc_Ntk_t *pNtkQbf_local;
  Abc_Ntk_t *pNtk1_local;
  
  XorOuts.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = ILP_Constraint;
  std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::vector
            ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj);
  for (local_54 = 0; iVar2 = Abc_NtkPoNum(pNtk1), local_54 < iVar2; local_54 = local_54 + 1) {
    pObjTmp = Abc_NtkPo(pNtk1,local_54);
    poVar3 = std::operator<<((ostream *)&std::cout,"Print Xor : ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Abc_AigPrintNode((pObjTmp->field_6).pCopy);
    pAVar4 = Abc_ObjChild0Copy(pObjTmp);
    Abc_AigPrintNode(pAVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,"END.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pAVar1 = (Abc_Aig_t *)pNtkQbf->pManFunc;
    pAVar4 = (pObjTmp->field_6).pCopy;
    pAVar7 = Abc_ObjChild0Copy(pObjTmp);
    pName = (char *)Abc_AigXor(pAVar1,pAVar4,pAVar7);
    std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
              ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj,(value_type *)&pName);
  }
  ppAVar5 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                      ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj,0);
  pName = (char *)*ppAVar5;
  local_68 = 1;
  sVar6 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::size
                    ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj);
  for (; p0 = pName, local_68 < (int)sVar6; local_68 = local_68 + 1) {
    pAVar1 = (Abc_Aig_t *)pNtkQbf->pManFunc;
    ppAVar5 = std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::operator[]
                        ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj,(long)local_68
                        );
    pName = (char *)Abc_AigOr(pAVar1,(Abc_Obj_t *)p0,*ppAVar5);
  }
  pObjTmp = Abc_NtkCreatePo(pNtkQbf);
  Abc_ObjAssignName(pObjTmp,"MainOut",(char *)0x0);
  pAVar4 = pObjTmp;
  pAVar7 = Abc_ObjNot((Abc_Obj_t *)pName);
  Abc_ObjAddFanin(pAVar4,pAVar7);
  Abc_AigCleanup((Abc_Aig_t *)pNtkQbf->pManFunc);
  std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::~vector
            ((vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *)&pObj);
  return;
}

Assistant:

void Bmatch_PrepareFinalOut 	( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtkQbf, int ILP_Constraint )
{
	vector< Abc_Obj_t * > XorOuts;
	Abc_Obj_t * pObj, * pObjTmp;
	char * pName;
	int i;

	Abc_NtkForEachPo( pNtk1, pObj, i ) {
cout << "Print Xor : " << endl;
		Abc_AigPrintNode(pObj->pCopy);
		Abc_AigPrintNode(Abc_ObjChild0Copy(pObj));
cout << "END." << endl;
		pObjTmp = Abc_AigXor( (Abc_Aig_t *)pNtkQbf->pManFunc, pObj->pCopy, Abc_ObjChild0Copy(pObj) );
		XorOuts.push_back( pObjTmp );
	}

	pObjTmp = XorOuts[0];
	for( int i = 1, n = XorOuts.size(); i < n; ++i ) {
		pObjTmp = Abc_AigOr( (Abc_Aig_t *)pNtkQbf->pManFunc, pObjTmp, XorOuts[i] );
	}

	pObj = Abc_NtkCreatePo( pNtkQbf );
	pName = "MainOut";
	Abc_ObjAssignName( pObj, pName, NULL );
	Abc_ObjAddFanin( pObj, Abc_ObjNot( pObjTmp ) );

	Abc_AigCleanup( (Abc_Aig_t *)pNtkQbf->pManFunc );
}